

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

StringLiteral * __thiscall
slang::BumpAllocator::
emplace<slang::ast::StringLiteral,slang::ast::Type_const&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue&,slang::SourceRange>
          (BumpAllocator *this,Type *args,basic_string_view<char,_std::char_traits<char>_> *args_1,
          basic_string_view<char,_std::char_traits<char>_> *args_2,ConstantValue *args_3,
          SourceRange *args_4)

{
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  SourceLocation SVar5;
  SourceLocation SVar6;
  StringLiteral *pSVar7;
  
  pSVar7 = (StringLiteral *)allocate(this,0x58,8);
  sVar1 = args_1->_M_len;
  pcVar2 = args_1->_M_str;
  sVar3 = args_2->_M_len;
  pcVar4 = args_2->_M_str;
  SVar5 = args_4->startLoc;
  SVar6 = args_4->endLoc;
  (pSVar7->super_Expression).kind = StringLiteral;
  (pSVar7->super_Expression).type.ptr = args;
  (pSVar7->super_Expression).constant = (ConstantValue *)0x0;
  (pSVar7->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (pSVar7->super_Expression).sourceRange.startLoc = SVar5;
  (pSVar7->super_Expression).sourceRange.endLoc = SVar6;
  (pSVar7->value)._M_len = sVar1;
  (pSVar7->value)._M_str = pcVar2;
  (pSVar7->rawValue)._M_len = sVar3;
  (pSVar7->rawValue)._M_str = pcVar4;
  pSVar7->intStorage = args_3;
  return pSVar7;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }